

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_TapscriptTreeFromWitness_Test::TestBody
          (cfdcapi_script_TapscriptTreeFromWitness_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  char *str_buffer;
  AssertionResult gtest_ar_14;
  int tmp_ret;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  char *tree_str;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *control_block;
  char *witness_program;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  char *leaf_hash;
  char *tapscript;
  uint8_t leaf_version;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *internal_pubkey;
  AssertionResult gtest_ar_1;
  void *tree_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffae8;
  AssertionResult *in_stack_fffffffffffffaf0;
  CfdErrorCode *in_stack_fffffffffffffaf8;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  void **in_stack_fffffffffffffb08;
  void *in_stack_fffffffffffffb28;
  char **in_stack_fffffffffffffb80;
  AssertionResult *in_stack_fffffffffffffb88;
  AssertionResult *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  void **in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  char *in_stack_fffffffffffffbe0;
  AssertionResult *in_stack_fffffffffffffbe8;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_33c;
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  char **in_stack_fffffffffffffce8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcf0;
  AssertHelper in_stack_fffffffffffffcf8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  AssertionResult local_2f0;
  char *local_2e0;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined4 local_2c4;
  AssertionResult local_2c0;
  int local_2ac;
  AssertHelper local_2a8;
  Message local_2a0 [2];
  char **in_stack_fffffffffffffd70;
  AssertHelper in_stack_fffffffffffffd78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  void *in_stack_fffffffffffffd90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd98;
  AssertHelper local_258;
  Message local_250;
  AssertionResult local_248;
  AssertHelper local_238;
  Message local_230;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  AssertionResult local_208;
  AssertHelper in_stack_fffffffffffffe08;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  void *in_stack_fffffffffffffe20;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe28;
  AssertHelper local_1c0;
  Message local_1b8;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150;
  undefined4 local_144;
  AssertionResult local_140;
  char *local_130;
  char *local_128;
  undefined1 local_119;
  AssertHelper local_118;
  Message local_110;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined4 local_e4;
  AssertionResult local_e0;
  char *local_d0;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffb08);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb08,
             (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
             in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3aadda);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x186,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3aae3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aae92);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,(type *)0x3aaec6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x187,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3aafc2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab03d);
  local_a0 = 0;
  local_14 = CfdInitializeTaprootScriptTree
                       ((void *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                        in_stack_fffffffffffffbd0);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb08,
             (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
             in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ab112);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x18b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3ab175);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab1cd);
  if (local_14 == 0) {
    local_d0 = (char *)0x0;
    local_14 = CfdSetTapScriptByWitnessStack
                         (in_stack_fffffffffffffe28.ptr_,in_stack_fffffffffffffe20,
                          (char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                          (char *)in_stack_fffffffffffffe10.ptr_,
                          (char **)in_stack_fffffffffffffe08.data_);
    local_e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ab2c6);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x192,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x3ab329);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab37e);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_108,
                 "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
                 "internal_pubkey",
                 "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",local_d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
      if (!bVar1) {
        testing::Message::Message(&local_110);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ab42d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x196,pcVar3);
        testing::internal::AssertHelper::operator=(&local_118,&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        testing::Message::~Message((Message *)0x3ab490);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab4e5);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
      local_d0 = (char *)0x0;
    }
    local_119 = 0;
    local_128 = (char *)0x0;
    local_130 = (char *)0x0;
    local_14 = CfdGetBaseTapLeaf((void *)CONCAT44(in_stack_fffffffffffffd0c,
                                                  in_stack_fffffffffffffd08),
                                 in_stack_fffffffffffffd00.ptr_,
                                 (uint8_t *)in_stack_fffffffffffffcf8.data_,
                                 (char **)in_stack_fffffffffffffcf0.ptr_,in_stack_fffffffffffffce8);
    local_144 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ab601);
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1a0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      testing::Message::~Message((Message *)0x3ab664);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab6bc);
    if (local_14 == 0) {
      local_16c = 0xc0;
      testing::internal::EqHelper<false>::Compare<int,unsigned_char>
                ((char *)in_stack_fffffffffffffb08,
                 (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                 in_stack_fffffffffffffaf8,&in_stack_fffffffffffffaf0->success_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ab777);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1a2,pcVar3);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        testing::Message::~Message((Message *)0x3ab7da);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab82f);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_190,
                 "\"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac\"",
                 "tapscript","201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
                 local_128);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
      if (!bVar1) {
        testing::Message::Message(&local_198);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ab8d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1a5,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        testing::Message::~Message((Message *)0x3ab933);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ab988);
      in_stack_fffffffffffffbe8 = &local_1b0;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffbe8,
                 "\"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513\"","leaf_hash",
                 "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",local_130);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffbe8);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        in_stack_fffffffffffffbe0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3aba29);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1a8,in_stack_fffffffffffffbe0);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        testing::Message::~Message((Message *)0x3aba8c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3abae1);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
      local_128 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
      local_130 = (char *)0x0;
    }
    local_14 = CfdGetTaprootScriptTreeHash
                         (in_stack_fffffffffffffd98.ptr_,in_stack_fffffffffffffd90,
                          (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                          (char **)in_stack_fffffffffffffd80.ptr_,
                          (char **)in_stack_fffffffffffffd78.data_,in_stack_fffffffffffffd70);
    pAVar4 = (AssertionResult *)&stack0xfffffffffffffe20;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe10);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3abc15);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1b6,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe08,(Message *)&stack0xfffffffffffffe10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe08);
      testing::Message::~Message((Message *)0x3abc78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3abccd);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_208,
                 "\"3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2\"",
                 "witness_program",
                 "3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2",(char *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
      if (!bVar1) {
        testing::Message::Message(&local_210);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3abd7c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1ba,pcVar3);
        testing::internal::AssertHelper::operator=(&local_218,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        testing::Message::~Message((Message *)0x3abddf);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3abe34);
      in_stack_fffffffffffffba0 = &local_228;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffba0,
                 "\"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513\"","leaf_hash",
                 "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",local_130);
      in_stack_fffffffffffffbaf =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffba0);
      if (!(bool)in_stack_fffffffffffffbaf) {
        testing::Message::Message(&local_230);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3abed5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1bd,pcVar3);
        testing::internal::AssertHelper::operator=(&local_238,&local_230);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        testing::Message::~Message((Message *)0x3abf38);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3abf8d);
      in_stack_fffffffffffffb88 = &local_248;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffb88,
                 "\"c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54\""
                 ,"control_block",
                 "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
                 ,(char *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffb88);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        in_stack_fffffffffffffb80 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3ac02e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1c0,(char *)in_stack_fffffffffffffb80);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        testing::Message::~Message((Message *)0x3ac091);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ac0e6);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
      local_130 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
    }
    local_14 = CfdGetTaprootScriptTreeSrting
                         (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                          (char **)CONCAT17(uVar2,in_stack_fffffffffffffbd8));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd90);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd80);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ac210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1cb,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd78,(Message *)&stack0xfffffffffffffd80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd78);
      testing::Message::~Message((Message *)0x3ac273);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ac2c8);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)(local_2a0 + 1),
                 "\"{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}\""
                 ,"tree_str",
                 "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}"
                 ,(char *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_2a0 + 1));
      if (!bVar1) {
        testing::Message::Message(local_2a0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ac36b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x1cf,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2a8,local_2a0);
        testing::internal::AssertHelper::~AssertHelper(&local_2a8);
        testing::Message::~Message((Message *)0x3ac3c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ac41d);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
    }
    local_2ac = CfdFreeTaprootScriptTreeHandle
                          ((void *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                           in_stack_fffffffffffffba0);
    local_2c4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ac4f5);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1d5,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
      testing::Message::~Message((Message *)0x3ac552);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ac5a7);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffb28);
  if (local_14 != 0) {
    local_2e0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    pAVar4 = &local_2f0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffb08,
               (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               in_stack_fffffffffffffaf8,(int *)in_stack_fffffffffffffaf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd00);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ac694);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffcf8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1dc,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffcf8,(Message *)&stack0xfffffffffffffd00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffcf8);
      testing::Message::~Message((Message *)0x3ac6f1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ac746);
    testing::internal::CmpHelperSTREQ
              ((internal *)&stack0xfffffffffffffce8,"\"\"","str_buffer","",local_2e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffce8);
    if (!bVar1) {
      testing::Message::Message(&local_320);
      in_stack_fffffffffffffb08 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3ac7db);
      testing::internal::AssertHelper::AssertHelper
                (&local_328,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1dd,(char *)in_stack_fffffffffffffb08);
      testing::internal::AssertHelper::operator=(&local_328,&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_328);
      testing::Message::~Message((Message *)0x3ac838);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ac88d);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffaf8);
    local_2e0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffaf8);
  local_33c = 0;
  pAVar4 = &local_338;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffb08,
             (char *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffaf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3ac95d);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1e3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message((Message *)0x3ac9ba);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aca0f);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeFromWitness) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tree_handle = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    char* internal_pubkey = nullptr;
    ret = CfdSetTapScriptByWitnessStack(handle, tree_handle,
        "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
        &internal_pubkey);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        internal_pubkey);
      CfdFreeStringBuffer(internal_pubkey);
      internal_pubkey = nullptr;
    }

    uint8_t leaf_version = 0;
    char* tapscript = nullptr;
    char* leaf_hash = nullptr;
    ret = CfdGetBaseTapLeaf(handle, tree_handle,
        &leaf_version, &tapscript, &leaf_hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(
        "201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
        tapscript);
      EXPECT_STREQ(
        "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
        leaf_hash);
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
    }

    char* witness_program = nullptr;
    char* control_block = nullptr;
    ret = CfdGetTaprootScriptTreeHash(handle, tree_handle,
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        &witness_program,
        &leaf_hash,
        &control_block);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2",
        witness_program);
      EXPECT_STREQ(
        "dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
        leaf_hash);
      EXPECT_STREQ(
        "c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        control_block);
      CfdFreeStringBuffer(witness_program);
      witness_program = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
      CfdFreeStringBuffer(control_block);
      control_block = nullptr;
    }

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    int tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}